

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeWindowsListByBeginStackParent
               (ImGuiWindow **windows,int windows_size,ImGuiWindow *parent_in_begin_stack)

{
  ImGuiWindow *window;
  int windows_size_00;
  ulong uVar1;
  ImGuiWindow **windows_00;
  bool bVar2;
  char buf [20];
  
  uVar1 = 0;
  if (0 < windows_size) {
    uVar1 = (ulong)(uint)windows_size;
  }
  windows_size_00 = windows_size + -1;
  windows_00 = windows + 1;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    window = windows_00[-1];
    if (window->ParentWindowInBeginStack == parent_in_begin_stack) {
      ImFormatString(buf,0x14,"[%04d] Window",(ulong)(uint)(int)window->BeginOrderWithinContext);
      DebugNodeWindow(window,buf);
      Indent(0.0);
      DebugNodeWindowsListByBeginStackParent(windows_00,windows_size_00,window);
      Unindent(0.0);
    }
    windows_size_00 = windows_size_00 + -1;
    windows_00 = windows_00 + 1;
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsListByBeginStackParent(ImGuiWindow** windows, int windows_size, ImGuiWindow* parent_in_begin_stack)
{
    for (int i = 0; i < windows_size; i++)
    {
        ImGuiWindow* window = windows[i];
        if (window->ParentWindowInBeginStack != parent_in_begin_stack)
            continue;
        char buf[20];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "[%04d] Window", window->BeginOrderWithinContext);
        //BulletText("[%04d] Window '%s'", window->BeginOrderWithinContext, window->Name);
        DebugNodeWindow(window, buf);
        Indent();
        DebugNodeWindowsListByBeginStackParent(windows + i + 1, windows_size - i - 1, window);
        Unindent();
    }
}